

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackNuGetGenerator.cxx
# Opt level: O0

int __thiscall cmCPackNuGetGenerator::PackageFiles(cmCPackNuGetGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  char *pcVar5;
  string local_3a0 [32];
  ostringstream local_380 [8];
  ostringstream cmCPackLog_msg_1;
  allocator<char> local_201;
  undefined1 local_200 [6];
  bool retval;
  allocator<char> local_1d9;
  string local_1d8;
  string local_1b8 [48];
  ostringstream local_188 [8];
  ostringstream cmCPackLog_msg;
  cmCPackNuGetGenerator *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar4 = std::operator<<((ostream *)local_188,"Toplevel: ");
  poVar4 = std::operator<<(poVar4,(string *)&(this->super_cmCPackGenerator).toplevel);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackNuGetGenerator.cxx"
                  ,0x19,pcVar5);
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&(this->super_cmCPackGenerator).packageFileNames);
  uVar3 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x19])();
  if ((uVar3 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_200,"CPACK_NUGET_ORDINAL_MONOLITIC",&local_201);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,(string *)local_200,"TRUE");
    std::__cxx11::string::~string((string *)local_200);
    std::allocator<char>::~allocator(&local_201);
  }
  else if ((this->super_cmCPackGenerator).componentPackageMethod == ONE_PACKAGE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,"CPACK_NUGET_ALL_IN_ONE",&local_1d9);
    cmCPackGenerator::SetOption(&this->super_cmCPackGenerator,&local_1d8,"TRUE");
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    SetupGroupComponentVariables(this,true);
  }
  else {
    SetupGroupComponentVariables
              (this,(this->super_cmCPackGenerator).componentPackageMethod ==
                    ONE_PACKAGE_PER_COMPONENT);
  }
  bVar2 = cmCPackGenerator::ReadListFile
                    (&this->super_cmCPackGenerator,"Internal/CPack/CPackNuGet.cmake");
  if (bVar2) {
    AddGeneratedPackageNames(this);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_380);
    poVar4 = std::operator<<((ostream *)local_380,"Error while execution CPackNuGet.cmake");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackNuGetGenerator.cxx"
                    ,0x39,pcVar5);
    std::__cxx11::string::~string(local_3a0);
    std::__cxx11::ostringstream::~ostringstream(local_380);
  }
  return (int)bVar2;
}

Assistant:

int cmCPackNuGetGenerator::PackageFiles()
{
  cmCPackLogger(cmCPackLog::LOG_DEBUG, "Toplevel: " << toplevel << std::endl);

  /* Reset package file name list it will be populated after the
   * `CPackNuGet.cmake` run */
  packageFileNames.clear();

  /* Are we in the component packaging case */
  if (WantsComponentInstallation()) {
    if (componentPackageMethod == ONE_PACKAGE) {
      // CASE 1 : COMPONENT ALL-IN-ONE package
      // Meaning that all per-component pre-installed files
      // goes into the single package.
      this->SetOption("CPACK_NUGET_ALL_IN_ONE", "TRUE");
      SetupGroupComponentVariables(true);
    } else {
      // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
      // There will be 1 package for each component group
      // however one may require to ignore component group and
      // in this case you'll get 1 package for each component.
      SetupGroupComponentVariables(componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
    }
  } else {
    // CASE 3 : NON COMPONENT package.
    this->SetOption("CPACK_NUGET_ORDINAL_MONOLITIC", "TRUE");
  }

  auto retval = this->ReadListFile("Internal/CPack/CPackNuGet.cmake");
  if (retval) {
    AddGeneratedPackageNames();
  } else {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Error while execution CPackNuGet.cmake" << std::endl);
  }

  return retval;
}